

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::StrAppend(string *result,AlphaNum *a,AlphaNum *b,AlphaNum *c,AlphaNum *d)

{
  size_type sVar1;
  pointer pcVar2;
  AlphaNum *x4;
  AlphaNum *x3;
  LogMessage *pLVar3;
  char *pcVar4;
  LogFinisher local_161;
  AlphaNum *local_160;
  AlphaNum *local_158;
  AlphaNum *local_150;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_160 = d;
  local_158 = c;
  if ((ulong)((long)a->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x643);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_68,
                        "CHECK failed: (uintptr_t((a).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar3);
    internal::LogMessage::~LogMessage(&local_68);
  }
  if ((ulong)((long)b->piece_data_ - (long)(result->_M_dataplus)._M_p) <= result->_M_string_length)
  {
    internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x644);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_a0,
                        "CHECK failed: (uintptr_t((b).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar3);
    internal::LogMessage::~LogMessage(&local_a0);
  }
  if ((ulong)((long)local_158->piece_data_ - (long)(result->_M_dataplus)._M_p) <=
      result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x645);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_d8,
                        "CHECK failed: (uintptr_t((c).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar3);
    internal::LogMessage::~LogMessage(&local_d8);
  }
  if ((ulong)((long)local_160->piece_data_ - (long)(result->_M_dataplus)._M_p) <=
      result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x646);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_110,
                        "CHECK failed: (uintptr_t((d).data() - (*result).data())) > (uintptr_t((*result).size())): "
                       );
    internal::LogFinisher::operator=((LogFinisher *)&local_148,pLVar3);
    internal::LogMessage::~LogMessage(&local_110);
  }
  x3 = local_158;
  x4 = local_160;
  sVar1 = result->_M_string_length;
  local_150 = b;
  std::__cxx11::string::resize
            ((ulong)result,
             (char)a->piece_size_ + (char)sVar1 + (char)b->piece_size_ +
             (char)local_158->piece_size_ + (char)local_160->piece_size_);
  pcVar2 = (result->_M_dataplus)._M_p;
  pcVar4 = Append4(pcVar2 + sVar1,a,local_150,x3,x4);
  if (pcVar4 != pcVar2 + result->_M_string_length) {
    internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
               ,0x64b);
    pLVar3 = internal::LogMessage::operator<<
                       (&local_148,"CHECK failed: (out) == (begin + result->size()): ");
    internal::LogFinisher::operator=(&local_161,pLVar3);
    internal::LogMessage::~LogMessage(&local_148);
  }
  return;
}

Assistant:

void StrAppend(std::string *result, const AlphaNum &a, const AlphaNum &b,
               const AlphaNum &c, const AlphaNum &d) {
  GOOGLE_DCHECK_NO_OVERLAP(*result, a);
  GOOGLE_DCHECK_NO_OVERLAP(*result, b);
  GOOGLE_DCHECK_NO_OVERLAP(*result, c);
  GOOGLE_DCHECK_NO_OVERLAP(*result, d);
  std::string::size_type old_size = result->size();
  result->resize(old_size + a.size() + b.size() + c.size() + d.size());
  char *const begin = &*result->begin();
  char *out = Append4(begin + old_size, a, b, c, d);
  GOOGLE_DCHECK_EQ(out, begin + result->size());
}